

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_rsassa_pkcs1_v15_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  mbedtls_md_info_t *md_info_00;
  uchar *puVar4;
  uchar *output;
  char *pcVar5;
  mbedtls_md_info_t *md_info;
  int ret;
  uchar diff_no_optimize;
  uchar diff;
  size_t i;
  uchar *verif;
  uchar *sig_try;
  char *oid;
  uchar *p;
  size_t oid_size;
  size_t olen;
  size_t nb_pad;
  mbedtls_md_type_t local_30;
  uint hashlen_local;
  mbedtls_md_type_t md_alg_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  p = (uchar *)0x0;
  oid = (char *)sig;
  sig_try = (uchar *)0x0;
  if ((mode == 1) && (ctx->padding != 0)) {
    return -0x4080;
  }
  oid_size = ctx->len;
  olen = oid_size - 3;
  nb_pad._4_4_ = hashlen;
  local_30 = md_alg;
  hashlen_local = mode;
  _md_alg_local = p_rng;
  p_rng_local = f_rng;
  f_rng_local = (_func_int_void_ptr_uchar_ptr_size_t *)ctx;
  if (md_alg != MBEDTLS_MD_NONE) {
    md_info_00 = mbedtls_md_info_from_type(md_alg);
    if (md_info_00 == (mbedtls_md_info_t *)0x0) {
      return -0x4080;
    }
    iVar3 = mbedtls_oid_get_oid_by_md(local_30,(char **)&sig_try,(size_t *)&p);
    if (iVar3 != 0) {
      return -0x4080;
    }
    olen = olen - (long)(p + 10);
    bVar2 = mbedtls_md_get_size(md_info_00);
    nb_pad._4_4_ = (uint)bVar2;
  }
  olen = olen - nb_pad._4_4_;
  if ((olen < 8) || (oid_size < olen)) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    pcVar5 = oid + 1;
    *oid = '\0';
    oid = oid + 2;
    *pcVar5 = '\x01';
    memset(oid,0xff,olen);
    pcVar5 = oid + olen;
    oid = pcVar5 + 1;
    *pcVar5 = '\0';
    if (local_30 == MBEDTLS_MD_NONE) {
      memcpy(oid,hash,(ulong)nb_pad._4_4_);
    }
    else {
      *oid = '0';
      cVar1 = (char)p;
      pcVar5[2] = cVar1 + '\b' + (char)nb_pad._4_4_;
      pcVar5[3] = '0';
      pcVar5[4] = cVar1 + '\x04';
      pcVar5[5] = '\x06';
      oid = pcVar5 + 7;
      pcVar5[6] = cVar1;
      memcpy(oid,sig_try,(size_t)p);
      puVar4 = p + (long)oid;
      *puVar4 = '\x05';
      puVar4[1] = '\0';
      puVar4[2] = '\x04';
      oid = (char *)(puVar4 + 4);
      puVar4[3] = (uchar)nb_pad._4_4_;
      memcpy(oid,hash,(ulong)nb_pad._4_4_);
    }
    if (hashlen_local == 0) {
      ctx_local._4_4_ = mbedtls_rsa_public((mbedtls_rsa_context *)f_rng_local,sig,sig);
    }
    else {
      puVar4 = (uchar *)calloc(1,*(size_t *)(f_rng_local + 8));
      if (puVar4 == (uchar *)0x0) {
        ctx_local._4_4_ = -0x10;
      }
      else {
        output = (uchar *)calloc(1,*(size_t *)(f_rng_local + 8));
        if (output == (uchar *)0x0) {
          free(puVar4);
          ctx_local._4_4_ = -0x10;
        }
        else {
          md_info._0_4_ =
               mbedtls_rsa_private((mbedtls_rsa_context *)f_rng_local,
                                   (_func_int_void_ptr_uchar_ptr_size_t *)p_rng_local,_md_alg_local,
                                   sig,puVar4);
          if (((int)md_info == 0) &&
             (md_info._0_4_ = mbedtls_rsa_public((mbedtls_rsa_context *)f_rng_local,puVar4,output),
             (int)md_info == 0)) {
            md_info._7_1_ = 0;
            for (_ret = 0; _ret < *(ulong *)(f_rng_local + 8); _ret = _ret + 1) {
              md_info._7_1_ = md_info._7_1_ | output[_ret] ^ sig[_ret];
            }
            if (md_info._7_1_ == 0) {
              memcpy(sig,puVar4,*(size_t *)(f_rng_local + 8));
            }
            else {
              md_info._0_4_ = -0x4300;
            }
          }
          free(puVar4);
          free(output);
          ctx_local._4_4_ = (int)md_info;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_sign( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               unsigned char *sig )
{
    size_t nb_pad, olen, oid_size = 0;
    unsigned char *p = sig;
    const char *oid = NULL;
    unsigned char *sig_try = NULL, *verif = NULL;
    size_t i;
    unsigned char diff;
    volatile unsigned char diff_no_optimize;
    int ret;

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V15 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    olen = ctx->len;
    nb_pad = olen - 3;

    if( md_alg != MBEDTLS_MD_NONE )
    {
        const mbedtls_md_info_t *md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        if( mbedtls_oid_get_oid_by_md( md_alg, &oid, &oid_size ) != 0 )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        nb_pad -= 10 + oid_size;

        hashlen = mbedtls_md_get_size( md_info );
    }

    nb_pad -= hashlen;

    if( ( nb_pad < 8 ) || ( nb_pad > olen ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    *p++ = 0;
    *p++ = MBEDTLS_RSA_SIGN;
    memset( p, 0xFF, nb_pad );
    p += nb_pad;
    *p++ = 0;

    if( md_alg == MBEDTLS_MD_NONE )
    {
        memcpy( p, hash, hashlen );
    }
    else
    {
        /*
         * DigestInfo ::= SEQUENCE {
         *   digestAlgorithm DigestAlgorithmIdentifier,
         *   digest Digest }
         *
         * DigestAlgorithmIdentifier ::= AlgorithmIdentifier
         *
         * Digest ::= OCTET STRING
         */
        *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
        *p++ = (unsigned char) ( 0x08 + oid_size + hashlen );
        *p++ = MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED;
        *p++ = (unsigned char) ( 0x04 + oid_size );
        *p++ = MBEDTLS_ASN1_OID;
        *p++ = oid_size & 0xFF;
        memcpy( p, oid, oid_size );
        p += oid_size;
        *p++ = MBEDTLS_ASN1_NULL;
        *p++ = 0x00;
        *p++ = MBEDTLS_ASN1_OCTET_STRING;
        *p++ = hashlen;
        memcpy( p, hash, hashlen );
    }

    if( mode == MBEDTLS_RSA_PUBLIC )
        return( mbedtls_rsa_public(  ctx, sig, sig ) );

    /*
     * In order to prevent Lenstra's attack, make the signature in a
     * temporary buffer and check it before returning it.
     */
    sig_try = mbedtls_calloc( 1, ctx->len );
    if( sig_try == NULL )
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );

    verif   = mbedtls_calloc( 1, ctx->len );
    if( verif == NULL )
    {
        mbedtls_free( sig_try );
        return( MBEDTLS_ERR_MPI_ALLOC_FAILED );
    }

    MBEDTLS_MPI_CHK( mbedtls_rsa_private( ctx, f_rng, p_rng, sig, sig_try ) );
    MBEDTLS_MPI_CHK( mbedtls_rsa_public( ctx, sig_try, verif ) );

    /* Compare in constant time just in case */
    for( diff = 0, i = 0; i < ctx->len; i++ )
        diff |= verif[i] ^ sig[i];
    diff_no_optimize = diff;

    if( diff_no_optimize != 0 )
    {
        ret = MBEDTLS_ERR_RSA_PRIVATE_FAILED;
        goto cleanup;
    }

    memcpy( sig, sig_try, ctx->len );

cleanup:
    mbedtls_free( sig_try );
    mbedtls_free( verif );

    return( ret );
}